

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeTransferError(Vdbe *p)

{
  sqlite3_value *psVar1;
  long *in_RDI;
  int rc;
  sqlite3_value *unaff_retaddr;
  sqlite3 *db;
  int iVar2;
  sqlite3 *db_00;
  int n;
  
  db_00 = (sqlite3 *)*in_RDI;
  iVar2 = *(int *)((long)in_RDI + 0x34);
  if (in_RDI[0x15] == 0) {
    if (db_00->pErr != (sqlite3_value *)0x0) {
      sqlite3ValueSetNull((sqlite3_value *)0x17046f);
    }
  }
  else {
    db_00->bBenignMalloc = db_00->bBenignMalloc + '\x01';
    sqlite3BeginBenignMalloc();
    n = (int)((ulong)in_RDI >> 0x20);
    if (db_00->pErr == (sqlite3_value *)0x0) {
      psVar1 = sqlite3ValueNew(db_00);
      db_00->pErr = psVar1;
    }
    sqlite3ValueSetStr(unaff_retaddr,n,db_00,(u8)((uint)iVar2 >> 0x18),
                       (_func_void_void_ptr *)0x17043a);
    sqlite3EndBenignMalloc();
    db_00->bBenignMalloc = db_00->bBenignMalloc + 0xff;
  }
  db_00->errCode = iVar2;
  db_00->errByteOffset = -1;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeTransferError(Vdbe *p){
  sqlite3 *db = p->db;
  int rc = p->rc;
  if( p->zErrMsg ){
    db->bBenignMalloc++;
    sqlite3BeginBenignMalloc();
    if( db->pErr==0 ) db->pErr = sqlite3ValueNew(db);
    sqlite3ValueSetStr(db->pErr, -1, p->zErrMsg, SQLITE_UTF8, SQLITE_TRANSIENT);
    sqlite3EndBenignMalloc();
    db->bBenignMalloc--;
  }else if( db->pErr ){
    sqlite3ValueSetNull(db->pErr);
  }
  db->errCode = rc;
  db->errByteOffset = -1;
  return rc;
}